

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
snappy::SnappyArrayWriter::TryFastAppend
          (SnappyArrayWriter *this,char *ip,size_t available,size_t len)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  
  pcVar1 = this->op_;
  bVar3 = 0xf < (ulong)((long)this->op_limit_ - (long)pcVar1);
  if ((0x14 < available && len < 0x11) && bVar3) {
    uVar2 = *(undefined8 *)(ip + 8);
    *(undefined8 *)pcVar1 = *(undefined8 *)ip;
    *(undefined8 *)(pcVar1 + 8) = uVar2;
    this->op_ = pcVar1 + len;
  }
  return (0x14 < available && len < 0x11) && bVar3;
}

Assistant:

inline bool TryFastAppend(const char* ip, size_t available, size_t len) {
    char* op = op_;
    const size_t space_left = op_limit_ - op;
    if (len <= 16 && available >= 16 + kMaximumTagLength && space_left >= 16) {
      // Fast path, used for the majority (about 95%) of invocations.
      UnalignedCopy128(ip, op);
      op_ = op + len;
      return true;
    } else {
      return false;
    }
  }